

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

string * chaiscript::exception::load_module_error::format_error
                   (string *__return_storage_ptr__,string *t_name,
                   vector<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
                   *t_errors)

{
  pointer plVar1;
  ostream *poVar2;
  char *pcVar3;
  load_module_error *err;
  pointer plVar4;
  stringstream ss;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar2 = std::operator<<(local_1a8,"Error loading module \'");
  poVar2 = std::operator<<(poVar2,(string *)t_name);
  poVar2 = std::operator<<(poVar2,"\'\n");
  std::operator<<(poVar2,"  The following locations were searched:\n");
  plVar1 = (t_errors->
           super__Vector_base<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (plVar4 = (t_errors->
                super__Vector_base<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
                )._M_impl.super__Vector_impl_data._M_start; plVar4 != plVar1; plVar4 = plVar4 + 1) {
    poVar2 = std::operator<<(local_1a8,"    ");
    pcVar3 = (char *)(**(code **)(*(long *)plVar4 + 0x10))(plVar4);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,"\n");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

static std::string format_error(const std::string &t_name, const std::vector<load_module_error> &t_errors) {
        std::stringstream ss;
        ss << "Error loading module '" << t_name << "'\n"
           << "  The following locations were searched:\n";

        for (const auto &err : t_errors) {
          ss << "    " << err.what() << "\n";
        }

        return ss.str();
      }